

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

bool bssl::ssl_can_renegotiate(SSL *ssl)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  SSL *ssl_local;
  
  if (((ssl->field_0xa4 & 1) == 0) && (iVar3 = SSL_is_dtls(ssl), iVar3 == 0)) {
    if ((ssl->s3->version == 0) || (uVar2 = ssl_protocol_version(ssl), uVar2 < 0x304)) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ssl->config);
      if (bVar1) {
        switch(ssl->renegotiate_mode) {
        case ssl_renegotiate_never:
        case ssl_renegotiate_ignore:
          ssl_local._7_1_ = false;
          break;
        case ssl_renegotiate_once:
          ssl_local._7_1_ = ssl->s3->total_renegotiations == 0;
          break;
        case ssl_renegotiate_freely:
        case ssl_renegotiate_explicit:
          ssl_local._7_1_ = true;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                        ,0x135,"bool bssl::ssl_can_renegotiate(const SSL *)");
        }
      }
      else {
        ssl_local._7_1_ = false;
      }
    }
    else {
      ssl_local._7_1_ = false;
    }
  }
  else {
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

static bool ssl_can_renegotiate(const SSL *ssl) {
  if (ssl->server || SSL_is_dtls(ssl)) {
    return false;
  }

  if (ssl->s3->version != 0  //
      && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return false;
  }

  // The config has already been shed.
  if (!ssl->config) {
    return false;
  }

  switch (ssl->renegotiate_mode) {
    case ssl_renegotiate_ignore:
    case ssl_renegotiate_never:
      return false;

    case ssl_renegotiate_freely:
    case ssl_renegotiate_explicit:
      return true;
    case ssl_renegotiate_once:
      return ssl->s3->total_renegotiations == 0;
  }

  assert(0);
  return false;
}